

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O0

cmValue cmTargetPropertyComputer::GetProperty<cmTarget>(cmTarget *tgt,string *prop,cmMakefile *mf)

{
  bool bVar1;
  cmMakefile *mf_local;
  string *prop_local;
  cmTarget *tgt_local;
  cmValue loc;
  
  tgt_local = (cmTarget *)GetLocation<cmTarget>(tgt,prop,mf);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&tgt_local);
  if (!bVar1) {
    bVar1 = cmSystemTools::GetFatalErrorOccurred();
    if (bVar1) {
      cmValue::cmValue((cmValue *)&tgt_local,(nullptr_t)0x0);
    }
    else {
      bVar1 = std::operator==(prop,"SOURCES");
      if (bVar1) {
        tgt_local = (cmTarget *)GetSources<cmTarget>(tgt,mf);
      }
      else {
        cmValue::cmValue((cmValue *)&tgt_local,(nullptr_t)0x0);
      }
    }
  }
  return (cmValue)(string *)tgt_local;
}

Assistant:

static cmValue GetProperty(Target const* tgt, const std::string& prop,
                             cmMakefile const& mf)
  {
    if (cmValue loc = GetLocation(tgt, prop, mf)) {
      return loc;
    }
    if (cmSystemTools::GetFatalErrorOccurred()) {
      return nullptr;
    }
    if (prop == "SOURCES") {
      return GetSources(tgt, mf);
    }
    return nullptr;
  }